

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O0

FArchive * operator<<(FArchive *arc,secspecial_t *p)

{
  FArchive *pFVar1;
  secspecial_t *p_local;
  FArchive *arc_local;
  
  pFVar1 = FArchive::operator<<(arc,&p->special);
  pFVar1 = FArchive::operator<<(pFVar1,&p->damageamount);
  pFVar1 = FArchive::operator<<(pFVar1,(FName *)p);
  pFVar1 = FArchive::operator<<(pFVar1,&p->damageinterval);
  pFVar1 = FArchive::operator<<(pFVar1,&p->leakydamage);
  FArchive::operator<<(pFVar1,&p->Flags);
  return arc;
}

Assistant:

FArchive &operator<< (FArchive &arc, secspecial_t &p)
{
	arc << p.special
		<< p.damageamount
		<< p.damagetype
		<< p.damageinterval
		<< p.leakydamage
		<< p.Flags;
	return arc;
}